

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::~CopyingFileOutputStream
          (CopyingFileOutputStream *this)

{
  bool bVar1;
  LogMessage *pLVar2;
  char *value;
  LogFinisher local_49;
  LogMessage local_48;
  CopyingFileOutputStream *local_10;
  CopyingFileOutputStream *this_local;
  
  (this->super_CopyingOutputStream)._vptr_CopyingOutputStream =
       (_func_int **)&PTR__CopyingFileOutputStream_0039ce18;
  local_10 = this;
  if (((this->close_on_delete_ & 1U) != 0) && (bVar1 = Close(this), !bVar1)) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_ERROR,"third_party/protobuf-lite/zero_copy_stream_impl.cc",0xbc);
    pLVar2 = internal::LogMessage::operator<<(&local_48,"close() failed: ");
    value = strerror(this->errno_);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
    internal::LogFinisher::operator=(&local_49,pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
  }
  CopyingOutputStream::~CopyingOutputStream(&this->super_CopyingOutputStream);
  return;
}

Assistant:

FileOutputStream::CopyingFileOutputStream::~CopyingFileOutputStream() {
  if (close_on_delete_) {
    if (!Close()) {
      GOOGLE_LOG(ERROR) << "close() failed: " << strerror(errno_);
    }
  }
}